

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

optional<tinyusdz::value::normal3d> * __thiscall
tinyusdz::Attribute::get_value<tinyusdz::value::normal3d>
          (optional<tinyusdz::value::normal3d> *__return_storage_ptr__,Attribute *this)

{
  optional<tinyusdz::value::normal3d> local_38;
  Attribute *local_18;
  Attribute *this_local;
  
  local_18 = this;
  this_local = (Attribute *)__return_storage_ptr__;
  primvar::PrimVar::get_value<tinyusdz::value::normal3d>(&local_38,&this->_var);
  nonstd::optional_lite::optional<tinyusdz::value::normal3d>::optional<tinyusdz::value::normal3d,_0>
            (__return_storage_ptr__,&local_38);
  nonstd::optional_lite::optional<tinyusdz::value::normal3d>::~optional(&local_38);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return _var.get_value<T>();
  }